

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O0

void __thiscall
HdmiCecAnalyzerResults::GenBubbleText
          (HdmiCecAnalyzerResults *this,U64 frame_index,DisplayBase display_base,bool tabular)

{
  Frame local_48 [8];
  Frame frame;
  undefined1 local_28;
  bool tabular_local;
  DisplayBase display_base_local;
  U64 frame_index_local;
  HdmiCecAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_48);
  this->mDisplayBase = display_base;
  this->mTabular = tabular;
  switch(local_28) {
  case 0:
    GenStartSeqBubble(this);
    break;
  case 1:
    GenHeaderBubble(this,local_48);
    break;
  case 2:
    GenOpCodeBubble(this,local_48);
    break;
  case 3:
    GenOperandBubble(this,local_48);
    break;
  case 4:
    GenEOMBubble(this,local_48);
    break;
  case 5:
    GenACKBubble(this,local_48);
  }
  Frame::~Frame(local_48);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenBubbleText( U64 frame_index, DisplayBase display_base, bool tabular )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );
    mDisplayBase = display_base;
    mTabular = tabular;

    switch( frame.mType )
    {
    case HdmiCec::FrameType_StartSeq:
        GenStartSeqBubble();
        break;
    case HdmiCec::FrameType_Header:
        GenHeaderBubble( frame );
        break;
    case HdmiCec::FrameType_OpCode:
        GenOpCodeBubble( frame );
        break;
    case HdmiCec::FrameType_Operand:
        GenOperandBubble( frame );
        break;
    case HdmiCec::FrameType_EOM:
        GenEOMBubble( frame );
        break;
    case HdmiCec::FrameType_ACK:
        GenACKBubble( frame );
        break;
    default:
        break;
    }
}